

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode cf_he_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  long *plVar1;
  uchar uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  undefined8 *puVar7;
  connectdata *pcVar8;
  curl_trc_feat *pcVar9;
  eyeballer *peVar10;
  ConnectBits CVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  undefined4 uVar18;
  CURLcode CVar19;
  timediff_t tVar20;
  Curl_addrinfo *pCVar21;
  Curl_addrinfo *pCVar22;
  int *piVar23;
  char *pcVar24;
  _Bool _Var25;
  Curl_addrinfo *addr;
  int added;
  long lVar26;
  int iVar27;
  Curl_addrinfo *pCVar28;
  void *pvVar29;
  int iVar30;
  bool bVar31;
  curltime cVar32;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  int local_c0;
  char *disphost;
  int port;
  int is_ipv6;
  ip_quadruple ipquad;
  char *host;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  pvVar6 = cf->ctx;
  *done = false;
  iVar27 = *(int *)((long)pvVar6 + 0x18);
  if (iVar27 == 2) {
    *done = true;
    return CURLE_OK;
  }
  pvVar29 = pvVar6;
  if (iVar27 == 1) goto LAB_0011b6cb;
  if (iVar27 != 0) {
    return CURLE_OK;
  }
  puVar7 = *(undefined8 **)((long)pvVar6 + 0x10);
  pcVar8 = cf->conn;
  tVar20 = Curl_timeleft(data,(curltime *)0x0,true);
  if (tVar20 < 0) {
    Curl_failf(data,"Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }
  cVar32 = Curl_now();
  *(time_t *)((long)pvVar6 + 0x38) = cVar32.tv_sec;
  *(int *)((long)pvVar6 + 0x40) = cVar32.tv_usec;
  uVar2 = pcVar8->ip_version;
  pCVar28 = (Curl_addrinfo *)*puVar7;
  if (uVar2 == '\x01') {
    iVar27 = 2;
    pCVar21 = addr_first_match(pCVar28,2);
    pCVar22 = (Curl_addrinfo *)0x0;
    local_c0 = 0;
  }
  else {
    if (uVar2 == '\x02') {
      iVar27 = 10;
      pCVar21 = addr_first_match(pCVar28,10);
      local_c0 = 0;
    }
    else {
      iVar27 = 10;
      pCVar21 = addr_first_match(pCVar28,10);
      local_c0 = 2;
      pCVar22 = addr_first_match(pCVar28,2);
      if (pCVar22 != (Curl_addrinfo *)0x0 || pCVar21 != (Curl_addrinfo *)0x0) goto LAB_0011b56c;
      local_c0 = 2;
      if (pCVar28 == (Curl_addrinfo *)0x0) {
        pCVar21 = (Curl_addrinfo *)0x0;
      }
      else {
        iVar27 = pCVar28->ai_family;
        pCVar21 = addr_first_match(pCVar28,iVar27);
      }
    }
    pCVar22 = (Curl_addrinfo *)0x0;
  }
LAB_0011b56c:
  bVar31 = pCVar21 == (Curl_addrinfo *)0x0;
  pCVar28 = pCVar22;
  if (bVar31) {
    pCVar28 = (Curl_addrinfo *)0x0;
  }
  addr = pCVar22;
  if (!bVar31 || pCVar22 == (Curl_addrinfo *)0x0) {
    addr = pCVar21;
  }
  if (addr == (Curl_addrinfo *)0x0) {
    return CURLE_COULDNT_CONNECT;
  }
  if (bVar31 && pCVar22 != (Curl_addrinfo *)0x0) {
    iVar27 = local_c0;
  }
  *(undefined8 *)((long)pvVar6 + 0x20) = 0;
  *(undefined8 *)((long)pvVar6 + 0x28) = 0;
  CVar19 = eyeballer_new((eyeballer **)((long)pvVar6 + 0x20),
                         *(cf_ip_connect_create **)((long)pvVar6 + 8),addr,iVar27,(eyeballer *)0x0,0
                         ,tVar20,EXPIRE_DNS_PER_NAME);
  if (CVar19 != CURLE_OK) {
    return CVar19;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
      ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 || (0 < pcVar9->log_level)))) &&
     (0 < cf->cft->log_level)) {
    peVar10 = *(eyeballer **)((long)pvVar6 + 0x20);
    Curl_trc_cf_infof(data,cf,"created %s (timeout %ldms)",peVar10->name,peVar10->timeoutms);
  }
  if (pCVar28 != (Curl_addrinfo *)0x0) {
    CVar19 = eyeballer_new((eyeballer **)((long)pvVar6 + 0x28),
                           *(cf_ip_connect_create **)((long)pvVar6 + 8),pCVar28,local_c0,
                           *(eyeballer **)((long)pvVar6 + 0x20),
                           (ulong)(data->set).happy_eyeballs_timeout,tVar20,EXPIRE_DNS_PER_NAME2);
    if (CVar19 != CURLE_OK) {
      return CVar19;
    }
    if ((((data->set).field_0x897 & 0x40) != 0) &&
       (((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 || (0 < pcVar9->log_level)) &&
        (0 < cf->cft->log_level)))) {
      peVar10 = *(eyeballer **)((long)pvVar6 + 0x28);
      Curl_trc_cf_infof(data,cf,"created %s (timeout %ldms)",peVar10->name,peVar10->timeoutms);
    }
    Curl_expire(data,(ulong)(data->set).happy_eyeballs_timeout,EXPIRE_HAPPY_EYEBALLS);
  }
  *(undefined4 *)((long)pvVar6 + 0x18) = 1;
  pvVar29 = cf->ctx;
LAB_0011b6cb:
  pcVar8 = cf->conn;
  do {
    *done = false;
    cVar32 = Curl_now();
    ipquad.remote_ip._0_8_ = cVar32.tv_sec;
    ipquad.remote_ip._8_4_ = cVar32.tv_usec;
    iVar30 = 0;
    iVar27 = 0;
    for (lVar26 = 0; lVar26 != 2; lVar26 = lVar26 + 1) {
      peVar10 = *(eyeballer **)((long)pvVar29 + lVar26 * 8 + 0x20);
      if ((peVar10 != (eyeballer *)0x0) && (bVar3 = peVar10->field_0x64, (bVar3 & 4) == 0)) {
        if ((bVar3 & 2) == 0) {
          iVar30 = iVar30 + 1;
        }
        else {
          _Var25 = (_Bool)(bVar3 >> 3 & 1);
          *done = _Var25;
          CVar19 = peVar10->result;
          if (CVar19 == CURLE_OK && _Var25 == false) {
            CVar19 = Curl_conn_cf_connect(peVar10->cf,data,done);
            peVar10->result = CVar19;
            if (CVar19 == CURLE_WEIRD_SERVER_REPLY) {
              peVar10->field_0x64 = peVar10->field_0x64 | 0x20;
              CVar19 = CURLE_WEIRD_SERVER_REPLY;
            }
            else if (CVar19 == CURLE_OK) {
              if (*done == true) {
                peVar10->field_0x64 = peVar10->field_0x64 | 0xc;
                CVar19 = CURLE_OK;
              }
              else {
                cVar32.tv_usec._0_1_ = ipquad.remote_ip[8];
                cVar32.tv_usec._1_1_ = ipquad.remote_ip[9];
                cVar32.tv_usec._2_1_ = ipquad.remote_ip[10];
                cVar32.tv_usec._3_1_ = ipquad.remote_ip[0xb];
                cVar32.tv_sec._0_1_ = ipquad.remote_ip[0];
                cVar32.tv_sec._1_1_ = ipquad.remote_ip[1];
                cVar32.tv_sec._2_1_ = ipquad.remote_ip[2];
                cVar32.tv_sec._3_1_ = ipquad.remote_ip[3];
                cVar32.tv_sec._4_1_ = ipquad.remote_ip[4];
                cVar32.tv_sec._5_1_ = ipquad.remote_ip[5];
                cVar32.tv_sec._6_1_ = ipquad.remote_ip[6];
                cVar32.tv_sec._7_1_ = ipquad.remote_ip[7];
                uVar13 = (peVar10->started).tv_sec;
                uVar14 = (peVar10->started).tv_usec;
                older.tv_usec = uVar14;
                older.tv_sec = uVar13;
                cVar32._12_4_ = 0;
                older._12_4_ = 0;
                tVar20 = Curl_timediff(cVar32,older);
                if (tVar20 < peVar10->timeoutms) {
                  CVar19 = peVar10->result;
                }
                else {
                  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                     ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar9->log_level)))) {
                    Curl_infof(data,"%s connect timeout after %ldms, move on!",peVar10->name);
                  }
                  peVar10->error = 0x6e;
                  CVar19 = CURLE_OPERATION_TIMEDOUT;
                }
              }
            }
          }
          peVar10->result = CVar19;
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
             (((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 ||
               (0 < pcVar9->log_level)) && (0 < cf->cft->log_level)))) {
            Curl_trc_cf_infof(data,cf,"%s connect -> %d, connected=%d",peVar10->name,(ulong)CVar19,
                              (ulong)*done);
            CVar19 = peVar10->result;
          }
          if (CVar19 == CURLE_OK) {
            if (*done != false) {
              *(eyeballer **)((long)pvVar29 + 0x30) = peVar10;
              *(undefined8 *)((long)pvVar29 + lVar26 * 8 + 0x20) = 0;
              break;
            }
            iVar27 = iVar27 + 1;
          }
          else if ((peVar10->field_0x64 & 4) == 0) {
            iVar4 = peVar10->error;
            if (iVar4 != 0) {
              (data->state).os_errno = iVar4;
              piVar23 = __errno_location();
              *piVar23 = iVar4;
            }
            tVar20 = Curl_timeleft(data,(curltime *)&ipquad,true);
            if (cf->sockindex == 0) {
              baller_next_addr(peVar10);
              if ((peVar10->addr == (Curl_addrinfo *)0x0) && ((peVar10->field_0x64 & 0x20) != 0)) {
                peVar10->addr = peVar10->first;
                peVar10->field_0x64 = (peVar10->field_0x64 & 0xde) + 1;
              }
              baller_start(cf,data,peVar10,tVar20);
              if ((peVar10->field_0x64 & 4) == 0) {
                if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                    ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar9->log_level)))) && (0 < cf->cft->log_level)) {
                  Curl_trc_cf_infof(data,cf,"%s trying next",peVar10->name);
                }
                iVar27 = iVar27 + 1;
                Curl_expire(data,0,EXPIRE_RUN_NOW);
                goto LAB_0011b92f;
              }
            }
            else {
              peVar10->field_0x64 = peVar10->field_0x64 & 0xf1 | 6;
              peVar10->result = CURLE_COULDNT_CONNECT;
              peVar10->error = 0;
            }
            if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar9->log_level)))) && (0 < cf->cft->log_level)) {
              Curl_trc_cf_infof(data,cf,"%s done",peVar10->name);
            }
          }
        }
      }
LAB_0011b92f:
    }
    if (*(long *)((long)pvVar29 + 0x30) != 0) {
      *done = true;
      *(undefined4 *)((long)pvVar6 + 0x18) = 2;
      cf->field_0x24 = cf->field_0x24 | 1;
      lVar26 = *(long *)((long)pvVar6 + 0x30);
      cf->next = *(Curl_cfilter **)(lVar26 + 0x28);
      *(undefined8 *)(lVar26 + 0x28) = 0;
      cf_he_ctx_clear(cf,data);
      if ((cf->conn->handler->protocol & 0x30) != 0) {
        Curl_pgrsTime(data,TIMER_APPCONNECT);
      }
      if (((((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
           ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 || (0 < pcVar9->log_level))
           )) && ((((0 < cf->cft->log_level &&
                    (CVar19 = Curl_conn_cf_get_ip_info(cf->next,data,&is_ipv6,&ipquad),
                    CVar19 == CURLE_OK)) &&
                   ((*cf->next->cft->get_host)(cf->next,data,&host,&disphost,&port),
                   ((data->set).field_0x897 & 0x40) != 0)) &&
                  ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 ||
                   (0 < pcVar9->log_level)))))) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"Connected to %s (%s) port %u",disphost,&ipquad,
                          (ulong)(uint)ipquad.remote_port);
      }
      plVar1 = &(data->info).numconnects;
      *plVar1 = *plVar1 + 1;
      return CURLE_OK;
    }
    if (iVar27 == 0 && iVar30 == 0) goto LAB_0011bb1f;
    tVar20 = Curl_timeleft(data,(curltime *)&ipquad,true);
    if (tVar20 < 0) {
      newer_01.tv_usec._0_1_ = ipquad.remote_ip[8];
      newer_01.tv_usec._1_1_ = ipquad.remote_ip[9];
      newer_01.tv_usec._2_1_ = ipquad.remote_ip[10];
      newer_01.tv_usec._3_1_ = ipquad.remote_ip[0xb];
      newer_01.tv_sec._0_1_ = ipquad.remote_ip[0];
      newer_01.tv_sec._1_1_ = ipquad.remote_ip[1];
      newer_01.tv_sec._2_1_ = ipquad.remote_ip[2];
      newer_01.tv_sec._3_1_ = ipquad.remote_ip[3];
      newer_01.tv_sec._4_1_ = ipquad.remote_ip[4];
      newer_01.tv_sec._5_1_ = ipquad.remote_ip[5];
      newer_01.tv_sec._6_1_ = ipquad.remote_ip[6];
      newer_01.tv_sec._7_1_ = ipquad.remote_ip[7];
      uVar17 = (data->progress).t_startsingle.tv_sec;
      uVar18 = (data->progress).t_startsingle.tv_usec;
      older_02.tv_usec = uVar18;
      older_02.tv_sec = uVar17;
      newer_01._12_4_ = 0;
      older_02._12_4_ = 0;
      tVar20 = Curl_timediff(newer_01,older_02);
      Curl_failf(data,"Connection timeout after %ld ms",tVar20);
      return CURLE_OPERATION_TIMEDOUT;
    }
    if (iVar30 < 1) break;
    iVar30 = 0;
    for (lVar26 = 0; lVar26 != 2; lVar26 = lVar26 + 1) {
      peVar10 = *(eyeballer **)((long)pvVar29 + lVar26 * 8 + 0x20);
      if (((peVar10 != (eyeballer *)0x0) && ((peVar10->field_0x64 & 2) == 0)) &&
         (((peVar10->primary != (eyeballer *)0x0 && ((peVar10->primary->field_0x64 & 4) != 0)) ||
          (newer.tv_usec._0_1_ = ipquad.remote_ip[8], newer.tv_usec._1_1_ = ipquad.remote_ip[9],
          newer.tv_usec._2_1_ = ipquad.remote_ip[10], newer.tv_usec._3_1_ = ipquad.remote_ip[0xb],
          newer.tv_sec._0_1_ = ipquad.remote_ip[0], newer.tv_sec._1_1_ = ipquad.remote_ip[1],
          newer.tv_sec._2_1_ = ipquad.remote_ip[2], newer.tv_sec._3_1_ = ipquad.remote_ip[3],
          newer.tv_sec._4_1_ = ipquad.remote_ip[4], newer.tv_sec._5_1_ = ipquad.remote_ip[5],
          newer.tv_sec._6_1_ = ipquad.remote_ip[6], newer.tv_sec._7_1_ = ipquad.remote_ip[7],
          newer._12_4_ = 0, older_00._12_4_ = 0,
          older_00._0_12_ = *(undefined1 (*) [12])((long)pvVar29 + 0x38),
          tVar20 = Curl_timediff(newer,older_00), peVar10->delay_ms <= tVar20)))) {
        tVar20 = Curl_timeleft(data,(curltime *)&ipquad,true);
        baller_start(cf,data,peVar10,tVar20);
        if ((peVar10->field_0x64 & 4) == 0) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
             (((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 ||
               (0 < pcVar9->log_level)) && (0 < cf->cft->log_level)))) {
            Curl_trc_cf_infof(data,cf,"%s starting (timeout=%ldms)",peVar10->name,peVar10->timeoutms
                             );
          }
          iVar27 = iVar27 + 1;
          iVar30 = iVar30 + 1;
        }
        else if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                 ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar9->log_level)))) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"%s done",peVar10->name);
        }
      }
    }
  } while (0 < iVar30);
  if (0 < iVar27) {
    *done = false;
    return CURLE_OK;
  }
LAB_0011bb1f:
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
      ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 || (0 < pcVar9->log_level)))) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"all eyeballers failed");
  }
  for (lVar26 = 0; lVar26 != 2; lVar26 = lVar26 + 1) {
    puVar7 = *(undefined8 **)((long)pvVar29 + lVar26 * 8 + 0x20);
    if (puVar7 != (undefined8 *)0x0) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
         (((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 || (0 < pcVar9->log_level))
          && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"%s assess started=%d, result=%d",*puVar7,
                          (ulong)(*(uint *)((long)puVar7 + 100) >> 1 & 1),
                          (ulong)*(uint *)((long)puVar7 + 0x5c));
      }
      if (((*(byte *)((long)puVar7 + 100) & 2) != 0) &&
         (CVar19 = *(CURLcode *)((long)puVar7 + 0x5c), CVar19 != CURLE_OK)) goto LAB_0011bbe1;
    }
  }
  CVar19 = CURLE_COULDNT_CONNECT;
LAB_0011bbe1:
  CVar11 = pcVar8->bits;
  lVar26 = 0xd0;
  if (((((ulong)CVar11 & 2) == 0) && (lVar26 = 0x108, ((ulong)CVar11 & 1) == 0)) &&
     (lVar26 = 0xb0, (CVar11._0_4_ >> 8 & 1) == 0)) {
    lVar26 = 0x80;
  }
  uVar12 = *(undefined8 *)((long)&(pcVar8->cpool_node)._list + lVar26);
  uVar5 = (pcVar8->primary).remote_port;
  newer_00.tv_usec._0_1_ = ipquad.remote_ip[8];
  newer_00.tv_usec._1_1_ = ipquad.remote_ip[9];
  newer_00.tv_usec._2_1_ = ipquad.remote_ip[10];
  newer_00.tv_usec._3_1_ = ipquad.remote_ip[0xb];
  newer_00.tv_sec._0_1_ = ipquad.remote_ip[0];
  newer_00.tv_sec._1_1_ = ipquad.remote_ip[1];
  newer_00.tv_sec._2_1_ = ipquad.remote_ip[2];
  newer_00.tv_sec._3_1_ = ipquad.remote_ip[3];
  newer_00.tv_sec._4_1_ = ipquad.remote_ip[4];
  newer_00.tv_sec._5_1_ = ipquad.remote_ip[5];
  newer_00.tv_sec._6_1_ = ipquad.remote_ip[6];
  newer_00.tv_sec._7_1_ = ipquad.remote_ip[7];
  uVar15 = (data->progress).t_startsingle.tv_sec;
  uVar16 = (data->progress).t_startsingle.tv_usec;
  older_01.tv_usec = uVar16;
  older_01.tv_sec = uVar15;
  newer_00._12_4_ = 0;
  older_01._12_4_ = 0;
  tVar20 = Curl_timediff(newer_00,older_01);
  pcVar24 = curl_easy_strerror(CVar19);
  Curl_failf(data,"Failed to connect to %s port %u after %ld ms: %s",uVar12,(ulong)uVar5,tVar20,
             pcVar24);
  if ((data->state).os_errno != 0x6e) {
    return CVar19;
  }
  return CURLE_OPERATION_TIMEDOUT;
}

Assistant:

static CURLcode cf_he_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool *done)
{
  struct cf_he_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  DEBUGASSERT(ctx);
  *done = FALSE;

  switch(ctx->state) {
    case SCFST_INIT:
      DEBUGASSERT(CURL_SOCKET_BAD == Curl_conn_cf_get_socket(cf, data));
      DEBUGASSERT(!cf->connected);
      result = start_connect(cf, data, ctx->remotehost);
      if(result)
        return result;
      ctx->state = SCFST_WAITING;
      FALLTHROUGH();
    case SCFST_WAITING:
      result = is_connected(cf, data, done);
      if(!result && *done) {
        DEBUGASSERT(ctx->winner);
        DEBUGASSERT(ctx->winner->cf);
        DEBUGASSERT(ctx->winner->cf->connected);
        /* we have a winner. Install and activate it.
         * close/free all others. */
        ctx->state = SCFST_DONE;
        cf->connected = TRUE;
        cf->next = ctx->winner->cf;
        ctx->winner->cf = NULL;
        cf_he_ctx_clear(cf, data);

        if(cf->conn->handler->protocol & PROTO_FAMILY_SSH)
          Curl_pgrsTime(data, TIMER_APPCONNECT); /* we are connected already */
        if(Curl_trc_cf_is_verbose(cf, data)) {
          struct ip_quadruple ipquad;
          int is_ipv6;
          if(!Curl_conn_cf_get_ip_info(cf->next, data, &is_ipv6, &ipquad)) {
            const char *host, *disphost;
            int port;
            cf->next->cft->get_host(cf->next, data, &host, &disphost, &port);
            CURL_TRC_CF(data, cf, "Connected to %s (%s) port %u",
                        disphost, ipquad.remote_ip, ipquad.remote_port);
          }
        }
        data->info.numconnects++; /* to track the # of connections made */
      }
      break;
    case SCFST_DONE:
      *done = TRUE;
      break;
  }
  return result;
}